

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O1

_binbuf * glist_writetobinbuf(_glist *x,int wholething)

{
  t_dataslot *ptVar1;
  undefined8 uVar2;
  t_symbol **pptVar3;
  int iVar4;
  int iVar5;
  _binbuf *x_00;
  t_symbol *ptVar6;
  t_template *ptVar7;
  t_symbol *ptVar8;
  t_gobj *ptVar9;
  long lVar10;
  int ntemplates;
  t_symbol **templatevec;
  int local_64;
  _glist *local_60;
  t_symbol **local_58;
  int local_4c;
  long local_48;
  t_symbol **local_40;
  long local_38;
  
  local_58 = (t_symbol **)getbytes(0);
  local_64 = 0;
  x_00 = binbuf_new();
  ptVar9 = x->gl_list;
  local_60 = x;
  if (ptVar9 != (t_gobj *)0x0) {
    do {
      if ((ptVar9->g_pd == scalar_class) &&
         ((wholething != 0 || (iVar4 = glist_isselected(local_60,ptVar9), iVar4 != 0)))) {
        canvas_addtemplatesforscalar
                  ((t_symbol *)ptVar9[1].g_pd,(t_word *)&ptVar9[1].g_next,&local_64,&local_58);
      }
      ptVar9 = ptVar9->g_next;
    } while (ptVar9 != (_gobj *)0x0);
  }
  local_4c = wholething;
  ptVar6 = gensym("data");
  binbuf_addv(x_00,"s;",ptVar6);
  local_48 = (long)local_64;
  if (0 < local_48) {
    local_40 = local_58;
    lVar10 = 0;
    do {
      pptVar3 = local_40;
      ptVar7 = template_findbyname(local_40[lVar10]);
      iVar4 = ptVar7->t_n;
      ptVar6 = gensym("template");
      local_38 = lVar10;
      gensym(pptVar3[lVar10]->s_name + 3);
      binbuf_addv(x_00,"ss;",ptVar6);
      if (0 < (long)iVar4) {
        lVar10 = 0;
        do {
          ptVar6 = &s_float;
          switch(*(undefined4 *)((long)&ptVar7->t_vec->ds_type + lVar10)) {
          case 0:
            break;
          case 1:
            ptVar6 = &s_symbol;
            break;
          case 2:
            ptVar6 = &s_list;
            break;
          case 3:
            ptVar6 = gensym("array");
            break;
          default:
            bug("canvas_write");
            ptVar6 = &s_float;
          }
          ptVar1 = ptVar7->t_vec;
          uVar2 = *(undefined8 *)((long)&ptVar1->ds_name + lVar10);
          if (*(int *)((long)&ptVar1->ds_type + lVar10) == 3) {
            ptVar8 = gensym((char *)(**(long **)((long)&ptVar1->ds_arraytemplate + lVar10) + 3));
            binbuf_addv(x_00,"sss;",ptVar6,uVar2,ptVar8);
          }
          else {
            binbuf_addv(x_00,"ss;",ptVar6);
          }
          lVar10 = lVar10 + 0x18;
        } while ((long)iVar4 * 0x18 != lVar10);
      }
      binbuf_addsemi(x_00);
      lVar10 = local_38 + 1;
    } while (lVar10 != local_48);
  }
  binbuf_addsemi(x_00);
  iVar4 = local_4c;
  for (ptVar9 = local_60->gl_list; ptVar9 != (t_gobj *)0x0; ptVar9 = ptVar9->g_next) {
    if ((ptVar9->g_pd == scalar_class) &&
       ((iVar4 != 0 || (iVar5 = glist_isselected(local_60,ptVar9), iVar5 != 0)))) {
      canvas_writescalar((t_symbol *)ptVar9[1].g_pd,(t_word *)&ptVar9[1].g_next,x_00,0);
    }
  }
  freebytes(local_58,local_48 << 3);
  return x_00;
}

Assistant:

t_binbuf *glist_writetobinbuf(t_glist *x, int wholething)
{
    int i;
    t_symbol **templatevec = getbytes(0);
    int ntemplates = 0;
    t_gobj *y;
    t_binbuf *b = binbuf_new();

    for (y = x->gl_list; y; y = y->g_next)
    {
        if ((pd_class(&y->g_pd) == scalar_class) &&
            (wholething || glist_isselected(x, y)))
        {
            canvas_addtemplatesforscalar(((t_scalar *)y)->sc_template,
                ((t_scalar *)y)->sc_vec,  &ntemplates, &templatevec);
        }
    }
    binbuf_addv(b, "s;", gensym("data"));
    for (i = 0; i < ntemplates; i++)
    {
        t_template *template = template_findbyname(templatevec[i]);
        int j, m = template->t_n;
            /* drop "pd-" prefix from template symbol to print it: */
        binbuf_addv(b, "ss;", gensym("template"),
            gensym(templatevec[i]->s_name + 3));
        for (j = 0; j < m; j++)
        {
            t_symbol *type;
            switch (template->t_vec[j].ds_type)
            {
                case DT_FLOAT: type = &s_float; break;
                case DT_SYMBOL: type = &s_symbol; break;
                case DT_ARRAY: type = gensym("array"); break;
                case DT_TEXT: type = &s_list; break;
                default: type = &s_float; bug("canvas_write");
            }
            if (template->t_vec[j].ds_type == DT_ARRAY)
                binbuf_addv(b, "sss;", type, template->t_vec[j].ds_name,
                    gensym(template->t_vec[j].ds_arraytemplate->s_name + 3));
            else binbuf_addv(b, "ss;", type, template->t_vec[j].ds_name);
        }
        binbuf_addsemi(b);
    }
    binbuf_addsemi(b);
        /* now write out the objects themselves */
    for (y = x->gl_list; y; y = y->g_next)
    {
        if ((pd_class(&y->g_pd) == scalar_class) &&
            (wholething || glist_isselected(x, y)))
        {
            canvas_writescalar(((t_scalar *)y)->sc_template,
                ((t_scalar *)y)->sc_vec,  b, 0);
        }
    }
    t_freebytes(templatevec, ntemplates*sizeof(*templatevec));
    return (b);
}